

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall Catch::ConsoleReporter::printTestCaseAndSectionHeader(ConsoleReporter *this)

{
  pointer pSVar1;
  ostream *os;
  size_t sVar2;
  ostream *poVar3;
  pointer pSVar4;
  Colour colourGuard_1;
  SourceLineInfo lineInfo;
  char local_2a [2];
  SourceLineInfo local_28;
  
  printOpenHeader(this,&((this->super_StreamingReporterBase<Catch::ConsoleReporter>).
                         currentTestCaseInfo.super_Option<Catch::TestCaseInfo>.nullableValue)->name)
  ;
  if (1 < (ulong)(((long)(this->super_StreamingReporterBase<Catch::ConsoleReporter>).m_sectionStack.
                         super__Vector_base<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(this->super_StreamingReporterBase<Catch::ConsoleReporter>).m_sectionStack.
                         super__Vector_base<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x3333333333333333)) {
    local_28.file = (char *)((ulong)local_28.file & 0xffffffffffffff00);
    Colour::use(Headers);
    pSVar4 = (this->super_StreamingReporterBase<Catch::ConsoleReporter>).m_sectionStack.
             super__Vector_base<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>._M_impl.
             super__Vector_impl_data._M_start;
    pSVar1 = (this->super_StreamingReporterBase<Catch::ConsoleReporter>).m_sectionStack.
             super__Vector_base<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>._M_impl.
             super__Vector_impl_data._M_finish;
    while (pSVar4 = pSVar4 + 1, pSVar4 != pSVar1) {
      printHeaderString(this,&pSVar4->name,2);
    }
    Colour::use(None);
  }
  pSVar4 = (this->super_StreamingReporterBase<Catch::ConsoleReporter>).m_sectionStack.
           super__Vector_base<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>._M_impl.
           super__Vector_impl_data._M_finish;
  local_28.file = pSVar4[-1].lineInfo.file;
  local_28.line = pSVar4[-1].lineInfo.line;
  if (*local_28.file != '\0') {
    poVar3 = (ostream *)(this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream;
    if (getLineOfChars<(char)45>()::line == '\0') {
      uRam00000000001a3d70 = 0x2d2d2d2d2d2d2d;
      uRam00000000001a3d77._0_1_ = '-';
      uRam00000000001a3d77._1_1_ = '-';
      uRam00000000001a3d77._2_1_ = '-';
      uRam00000000001a3d77._3_1_ = '-';
      uRam00000000001a3d77._4_1_ = '-';
      uRam00000000001a3d77._5_1_ = '-';
      uRam00000000001a3d77._6_1_ = '-';
      uRam00000000001a3d77._7_1_ = '-';
      DAT_001a3d60 = '-';
      DAT_001a3d60_1._0_1_ = '-';
      DAT_001a3d60_1._1_1_ = '-';
      DAT_001a3d60_1._2_1_ = '-';
      DAT_001a3d60_1._3_1_ = '-';
      DAT_001a3d60_1._4_1_ = '-';
      DAT_001a3d60_1._5_1_ = '-';
      DAT_001a3d60_1._6_1_ = '-';
      uRam00000000001a3d68 = 0x2d2d2d2d2d2d2d;
      DAT_001a3d6f = 0x2d;
      DAT_001a3d50 = '-';
      DAT_001a3d50_1._0_1_ = '-';
      DAT_001a3d50_1._1_1_ = '-';
      DAT_001a3d50_1._2_1_ = '-';
      DAT_001a3d50_1._3_1_ = '-';
      DAT_001a3d50_1._4_1_ = '-';
      DAT_001a3d50_1._5_1_ = '-';
      DAT_001a3d50_1._6_1_ = '-';
      uRam00000000001a3d58._0_1_ = '-';
      uRam00000000001a3d58._1_1_ = '-';
      uRam00000000001a3d58._2_1_ = '-';
      uRam00000000001a3d58._3_1_ = '-';
      uRam00000000001a3d58._4_1_ = '-';
      uRam00000000001a3d58._5_1_ = '-';
      uRam00000000001a3d58._6_1_ = '-';
      uRam00000000001a3d58._7_1_ = '-';
      DAT_001a3d40 = '-';
      DAT_001a3d40_1._0_1_ = '-';
      DAT_001a3d40_1._1_1_ = '-';
      DAT_001a3d40_1._2_1_ = '-';
      DAT_001a3d40_1._3_1_ = '-';
      DAT_001a3d40_1._4_1_ = '-';
      DAT_001a3d40_1._5_1_ = '-';
      DAT_001a3d40_1._6_1_ = '-';
      uRam00000000001a3d48._0_1_ = '-';
      uRam00000000001a3d48._1_1_ = '-';
      uRam00000000001a3d48._2_1_ = '-';
      uRam00000000001a3d48._3_1_ = '-';
      uRam00000000001a3d48._4_1_ = '-';
      uRam00000000001a3d48._5_1_ = '-';
      uRam00000000001a3d48._6_1_ = '-';
      uRam00000000001a3d48._7_1_ = '-';
      getLineOfChars<(char)45>()::line = '-';
      getLineOfChars<(char)45>()::line_1._0_1_ = '-';
      getLineOfChars<(char)45>()::line_1._1_1_ = '-';
      getLineOfChars<(char)45>()::line_1._2_1_ = '-';
      getLineOfChars<(char)45>()::line_1._3_1_ = '-';
      getLineOfChars<(char)45>()::line_1._4_1_ = '-';
      getLineOfChars<(char)45>()::line_1._5_1_ = '-';
      getLineOfChars<(char)45>()::line_1._6_1_ = '-';
      uRam00000000001a3d38._0_1_ = '-';
      uRam00000000001a3d38._1_1_ = '-';
      uRam00000000001a3d38._2_1_ = '-';
      uRam00000000001a3d38._3_1_ = '-';
      uRam00000000001a3d38._4_1_ = '-';
      uRam00000000001a3d38._5_1_ = '-';
      uRam00000000001a3d38._6_1_ = '-';
      uRam00000000001a3d38._7_1_ = '-';
      DAT_001a3d7f = 0;
    }
    sVar2 = strlen(&getLineOfChars<(char)45>()::line);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3,&getLineOfChars<(char)45>()::line,sVar2);
    local_2a[0] = '\n';
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,local_2a,1);
    local_2a[1] = 0;
    Colour::use(FileName);
    os = (this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream;
    operator<<(os,&local_28);
    local_2a[0] = '\n';
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)os,local_2a,1);
    Colour::use(None);
  }
  poVar3 = (ostream *)(this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream;
  if (getLineOfChars<(char)46>()::line == '\0') {
    uRam00000000001a3e10 = 0x2e2e2e2e2e2e2e;
    uRam00000000001a3e17._0_1_ = '.';
    uRam00000000001a3e17._1_1_ = '.';
    uRam00000000001a3e17._2_1_ = '.';
    uRam00000000001a3e17._3_1_ = '.';
    uRam00000000001a3e17._4_1_ = '.';
    uRam00000000001a3e17._5_1_ = '.';
    uRam00000000001a3e17._6_1_ = '.';
    uRam00000000001a3e17._7_1_ = '.';
    DAT_001a3e00 = '.';
    DAT_001a3e00_1._0_1_ = '.';
    DAT_001a3e00_1._1_1_ = '.';
    DAT_001a3e00_1._2_1_ = '.';
    DAT_001a3e00_1._3_1_ = '.';
    DAT_001a3e00_1._4_1_ = '.';
    DAT_001a3e00_1._5_1_ = '.';
    DAT_001a3e00_1._6_1_ = '.';
    uRam00000000001a3e08 = 0x2e2e2e2e2e2e2e;
    DAT_001a3e0f = 0x2e;
    DAT_001a3df0 = '.';
    DAT_001a3df0_1._0_1_ = '.';
    DAT_001a3df0_1._1_1_ = '.';
    DAT_001a3df0_1._2_1_ = '.';
    DAT_001a3df0_1._3_1_ = '.';
    DAT_001a3df0_1._4_1_ = '.';
    DAT_001a3df0_1._5_1_ = '.';
    DAT_001a3df0_1._6_1_ = '.';
    uRam00000000001a3df8._0_1_ = '.';
    uRam00000000001a3df8._1_1_ = '.';
    uRam00000000001a3df8._2_1_ = '.';
    uRam00000000001a3df8._3_1_ = '.';
    uRam00000000001a3df8._4_1_ = '.';
    uRam00000000001a3df8._5_1_ = '.';
    uRam00000000001a3df8._6_1_ = '.';
    uRam00000000001a3df8._7_1_ = '.';
    DAT_001a3de0 = '.';
    DAT_001a3de0_1._0_1_ = '.';
    DAT_001a3de0_1._1_1_ = '.';
    DAT_001a3de0_1._2_1_ = '.';
    DAT_001a3de0_1._3_1_ = '.';
    DAT_001a3de0_1._4_1_ = '.';
    DAT_001a3de0_1._5_1_ = '.';
    DAT_001a3de0_1._6_1_ = '.';
    uRam00000000001a3de8._0_1_ = '.';
    uRam00000000001a3de8._1_1_ = '.';
    uRam00000000001a3de8._2_1_ = '.';
    uRam00000000001a3de8._3_1_ = '.';
    uRam00000000001a3de8._4_1_ = '.';
    uRam00000000001a3de8._5_1_ = '.';
    uRam00000000001a3de8._6_1_ = '.';
    uRam00000000001a3de8._7_1_ = '.';
    getLineOfChars<(char)46>()::line = '.';
    getLineOfChars<(char)46>()::line_1._0_1_ = '.';
    getLineOfChars<(char)46>()::line_1._1_1_ = '.';
    getLineOfChars<(char)46>()::line_1._2_1_ = '.';
    getLineOfChars<(char)46>()::line_1._3_1_ = '.';
    getLineOfChars<(char)46>()::line_1._4_1_ = '.';
    getLineOfChars<(char)46>()::line_1._5_1_ = '.';
    getLineOfChars<(char)46>()::line_1._6_1_ = '.';
    uRam00000000001a3dd8._0_1_ = '.';
    uRam00000000001a3dd8._1_1_ = '.';
    uRam00000000001a3dd8._2_1_ = '.';
    uRam00000000001a3dd8._3_1_ = '.';
    uRam00000000001a3dd8._4_1_ = '.';
    uRam00000000001a3dd8._5_1_ = '.';
    uRam00000000001a3dd8._6_1_ = '.';
    uRam00000000001a3dd8._7_1_ = '.';
    DAT_001a3e1f = 0;
  }
  sVar2 = strlen(&getLineOfChars<(char)46>()::line);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,&getLineOfChars<(char)46>()::line,sVar2)
  ;
  local_2a[0] = '\n';
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,local_2a,1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  return;
}

Assistant:

void ConsoleReporter::printTestCaseAndSectionHeader() {
    assert(!m_sectionStack.empty());
    printOpenHeader(currentTestCaseInfo->name);

    if (m_sectionStack.size() > 1) {
        Colour colourGuard(Colour::Headers);

        auto
            it = m_sectionStack.begin() + 1, // Skip first section (test case)
            itEnd = m_sectionStack.end();
        for (; it != itEnd; ++it)
            printHeaderString(it->name, 2);
    }

    SourceLineInfo lineInfo = m_sectionStack.back().lineInfo;

    if (!lineInfo.empty()) {
        stream << getLineOfChars<'-'>() << '\n';
        Colour colourGuard(Colour::FileName);
        stream << lineInfo << '\n';
    }
    stream << getLineOfChars<'.'>() << '\n' << std::endl;
}